

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void calculatePaintColors58H(uint8 d,uint8 p,uint8 (*colors) [3],uint8 (*possible_colors) [3])

{
  char cVar1;
  char *in_RCX;
  byte *in_RDX;
  char in_SIL;
  byte in_DIL;
  
  if ((int)((uint)in_RDX[3] - (uint)table58H[in_DIL]) < 0) {
    cVar1 = '\0';
  }
  else if ((int)((uint)in_RDX[3] - (uint)table58H[in_DIL]) < 0x100) {
    cVar1 = in_RDX[3] - table58H[in_DIL];
  }
  else {
    cVar1 = -1;
  }
  in_RCX[9] = cVar1;
  if ((int)((uint)in_RDX[4] - (uint)table58H[in_DIL]) < 0) {
    cVar1 = '\0';
  }
  else if ((int)((uint)in_RDX[4] - (uint)table58H[in_DIL]) < 0x100) {
    cVar1 = in_RDX[4] - table58H[in_DIL];
  }
  else {
    cVar1 = -1;
  }
  in_RCX[10] = cVar1;
  if ((int)((uint)in_RDX[5] - (uint)table58H[in_DIL]) < 0) {
    cVar1 = '\0';
  }
  else if ((int)((uint)in_RDX[5] - (uint)table58H[in_DIL]) < 0x100) {
    cVar1 = in_RDX[5] - table58H[in_DIL];
  }
  else {
    cVar1 = -1;
  }
  in_RCX[0xb] = cVar1;
  if (in_SIL != '\0') {
    printf("Invalid pattern. Terminating");
    exit(1);
  }
  if ((int)((uint)*in_RDX + (uint)table58H[in_DIL]) < 0) {
    cVar1 = '\0';
  }
  else if ((uint)*in_RDX + (uint)table58H[in_DIL] < 0x100) {
    cVar1 = *in_RDX + table58H[in_DIL];
  }
  else {
    cVar1 = -1;
  }
  *in_RCX = cVar1;
  if ((int)((uint)in_RDX[1] + (uint)table58H[in_DIL]) < 0) {
    cVar1 = '\0';
  }
  else if ((uint)in_RDX[1] + (uint)table58H[in_DIL] < 0x100) {
    cVar1 = in_RDX[1] + table58H[in_DIL];
  }
  else {
    cVar1 = -1;
  }
  in_RCX[1] = cVar1;
  if ((int)((uint)in_RDX[2] + (uint)table58H[in_DIL]) < 0) {
    cVar1 = '\0';
  }
  else if ((uint)in_RDX[2] + (uint)table58H[in_DIL] < 0x100) {
    cVar1 = in_RDX[2] + table58H[in_DIL];
  }
  else {
    cVar1 = -1;
  }
  in_RCX[2] = cVar1;
  if ((int)((uint)*in_RDX - (uint)table58H[in_DIL]) < 0) {
    cVar1 = '\0';
  }
  else if ((int)((uint)*in_RDX - (uint)table58H[in_DIL]) < 0x100) {
    cVar1 = *in_RDX - table58H[in_DIL];
  }
  else {
    cVar1 = -1;
  }
  in_RCX[3] = cVar1;
  if ((int)((uint)in_RDX[1] - (uint)table58H[in_DIL]) < 0) {
    cVar1 = '\0';
  }
  else if ((int)((uint)in_RDX[1] - (uint)table58H[in_DIL]) < 0x100) {
    cVar1 = in_RDX[1] - table58H[in_DIL];
  }
  else {
    cVar1 = -1;
  }
  in_RCX[4] = cVar1;
  if ((int)((uint)in_RDX[2] - (uint)table58H[in_DIL]) < 0) {
    cVar1 = '\0';
  }
  else if ((int)((uint)in_RDX[2] - (uint)table58H[in_DIL]) < 0x100) {
    cVar1 = in_RDX[2] - table58H[in_DIL];
  }
  else {
    cVar1 = -1;
  }
  in_RCX[5] = cVar1;
  if ((int)((uint)in_RDX[3] + (uint)table58H[in_DIL]) < 0) {
    cVar1 = '\0';
  }
  else if ((uint)in_RDX[3] + (uint)table58H[in_DIL] < 0x100) {
    cVar1 = in_RDX[3] + table58H[in_DIL];
  }
  else {
    cVar1 = -1;
  }
  in_RCX[6] = cVar1;
  if ((int)((uint)in_RDX[4] + (uint)table58H[in_DIL]) < 0) {
    cVar1 = '\0';
  }
  else if ((uint)in_RDX[4] + (uint)table58H[in_DIL] < 0x100) {
    cVar1 = in_RDX[4] + table58H[in_DIL];
  }
  else {
    cVar1 = -1;
  }
  in_RCX[7] = cVar1;
  if ((int)((uint)in_RDX[5] + (uint)table58H[in_DIL]) < 0) {
    cVar1 = '\0';
  }
  else if ((uint)in_RDX[5] + (uint)table58H[in_DIL] < 0x100) {
    cVar1 = in_RDX[5] + table58H[in_DIL];
  }
  else {
    cVar1 = -1;
  }
  in_RCX[8] = cVar1;
  return;
}

Assistant:

void calculatePaintColors58H(uint8 d, uint8 p, uint8 (colors)[2][3], uint8 (possible_colors)[4][3]) 
{
	
	//////////////////////////////////////////////
	//
	//		C3      C1		C4----C1---C2
	//		|		|			  |
	//		|		|			  |
	//		|-------|			  |
	//		|		|			  |
	//		|		|			  |
	//		C4      C2			  C3
	//
	//////////////////////////////////////////////

	// C4
	possible_colors[3][R] = CLAMP(0,colors[1][R] - table58H[d],255);
	possible_colors[3][G] = CLAMP(0,colors[1][G] - table58H[d],255);
	possible_colors[3][B] = CLAMP(0,colors[1][B] - table58H[d],255);
	
	if (p == PATTERN_H) 
	{ 
		// C1
		possible_colors[0][R] = CLAMP(0,colors[0][R] + table58H[d],255);
		possible_colors[0][G] = CLAMP(0,colors[0][G] + table58H[d],255);
		possible_colors[0][B] = CLAMP(0,colors[0][B] + table58H[d],255);
		// C2
		possible_colors[1][R] = CLAMP(0,colors[0][R] - table58H[d],255);
		possible_colors[1][G] = CLAMP(0,colors[0][G] - table58H[d],255);
		possible_colors[1][B] = CLAMP(0,colors[0][B] - table58H[d],255);
		// C3
		possible_colors[2][R] = CLAMP(0,colors[1][R] + table58H[d],255);
		possible_colors[2][G] = CLAMP(0,colors[1][G] + table58H[d],255);
		possible_colors[2][B] = CLAMP(0,colors[1][B] + table58H[d],255);
	} 
	else 
	{
		printf("Invalid pattern. Terminating");
		exit(1);
	}
}